

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MultipleDeclarationsInARangeCompile_Test>
::CreateTest(ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MultipleDeclarationsInARangeCompile_Test>
             *this)

{
  Test *this_00;
  
  WithParamInterface<google::protobuf::descriptor_unittest::ExtensionDeclarationsTestParams>::
  parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_018decb0;
  this_00[1]._vptr_Test =
       (_func_int **)
       &PTR__ExtensionDeclarationsTest_MultipleDeclarationsInARangeCompile_Test_018decf0;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }